

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_decoder.cc
# Opt level: O1

StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> * __thiscall
draco::StlDecoder::DecodeFromBuffer
          (StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>
           *__return_storage_ptr__,StlDecoder *this,DecoderBuffer *buffer)

{
  uint num_faces;
  char *pcVar1;
  pointer *ppcVar2;
  int iVar3;
  int att_id;
  long lVar4;
  undefined1 auVar5 [8];
  FaceIndex face_id;
  TriangleSoupMeshBuilder builder;
  unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> mesh;
  undefined4 local_f8;
  undefined4 local_f4;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined1 local_e8 [8];
  _Head_base<0UL,_draco::Mesh_*,_false> *p_Stack_e0;
  pointer local_d8;
  _Head_base<0UL,_draco::Mesh_*,_false> a_Stack_d0 [2];
  TriangleSoupMeshBuilder local_c0;
  StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *local_a0;
  pointer local_98;
  undefined4 local_90;
  pointer local_88;
  undefined4 local_80;
  pointer local_78;
  undefined8 uStack_70;
  pointer local_68;
  undefined8 uStack_60;
  Mesh *local_58;
  undefined8 uStack_50;
  pointer local_48;
  undefined8 uStack_40;
  
  pcVar1 = buffer->data_;
  lVar4 = buffer->pos_;
  iVar3 = strncmp(pcVar1 + lVar4,"solid ",6);
  if (iVar3 == 0) {
    ppcVar2 = &local_c0.attribute_element_types_.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    local_c0.attribute_element_types_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)ppcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"Currently only binary STL files are supported.","");
    local_e8._0_4_ = 0xfffffffe;
    p_Stack_e0 = a_Stack_d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&p_Stack_e0,
               local_c0.attribute_element_types_.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start,
               (long)((PointCloud *)
                     local_c0.attribute_element_types_.
                     super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                     super__Vector_impl_data._M_start)->named_attribute_index_ +
               CONCAT44(local_c0.attribute_element_types_.
                        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                        super__Vector_impl_data._M_finish._4_4_,
                        local_c0.attribute_element_types_.
                        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                        super__Vector_impl_data._M_finish._0_4_) + -0x28);
    (__return_storage_ptr__->status_).code_ = local_e8._0_4_;
    (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(__return_storage_ptr__->status_).error_msg_,p_Stack_e0,
               local_d8 + (long)p_Stack_e0);
    (__return_storage_ptr__->value_)._M_t.
    super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
    super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
    super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl = (Mesh *)0x0;
    if (p_Stack_e0 != a_Stack_d0) {
      operator_delete(p_Stack_e0,
                      (ulong)((long)&((a_Stack_d0[0]._M_head_impl)->super_PointCloud).
                                     _vptr_PointCloud + 1));
    }
    if ((pointer *)
        local_c0.attribute_element_types_.
        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start == ppcVar2) {
      return __return_storage_ptr__;
    }
    local_c0.attribute_element_types_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_c0.attribute_element_types_.
         super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage + 1;
    auVar5 = (undefined1  [8])
             local_c0.attribute_element_types_.
             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  else {
    buffer->pos_ = lVar4 + 0x50;
    num_faces = *(uint *)(pcVar1 + lVar4 + 0x50);
    buffer->pos_ = lVar4 + 0x54;
    local_d8 = (pointer)0x0;
    a_Stack_d0[0]._M_head_impl = (Mesh *)0x0;
    local_e8 = (undefined1  [8])0x0;
    p_Stack_e0 = (_Head_base<0UL,_draco::Mesh_*,_false> *)0x0;
    TriangleSoupMeshBuilder::Start((TriangleSoupMeshBuilder *)local_e8,num_faces);
    iVar3 = TriangleSoupMeshBuilder::AddAttribute
                      ((TriangleSoupMeshBuilder *)local_e8,POSITION,'\x03',DT_FLOAT32);
    local_a0 = __return_storage_ptr__;
    att_id = TriangleSoupMeshBuilder::AddAttribute
                       ((TriangleSoupMeshBuilder *)local_e8,NORMAL,'\x03',DT_FLOAT32);
    if (num_faces != 0) {
      face_id.value_ = 0;
      do {
        lVar4 = buffer->pos_;
        if (lVar4 + 0x30 <= buffer->data_size_) {
          pcVar1 = buffer->data_;
          local_48 = *(pointer *)(pcVar1 + lVar4);
          uStack_40 = 0;
          local_ec = *(undefined4 *)(pcVar1 + lVar4 + 8);
          local_58 = *(Mesh **)(pcVar1 + lVar4 + 0xc);
          uStack_50 = 0;
          local_f0 = *(undefined4 *)(pcVar1 + lVar4 + 0x14);
          local_68 = *(pointer *)(pcVar1 + lVar4 + 0x18);
          uStack_60 = 0;
          local_f8 = *(undefined4 *)(pcVar1 + lVar4 + 0x20);
          local_78 = *(pointer *)(pcVar1 + lVar4 + 0x24);
          uStack_70 = 0;
          local_f4 = *(undefined4 *)(pcVar1 + lVar4 + 0x2c);
          buffer->pos_ = lVar4 + 0x30;
        }
        lVar4 = buffer->pos_ + 2;
        if (lVar4 <= buffer->data_size_) {
          buffer->pos_ = lVar4;
        }
        local_c0.attribute_element_types_.
        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start = local_48;
        local_c0.attribute_element_types_.
        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = local_ec;
        TriangleSoupMeshBuilder::SetPerFaceAttributeValueForFace
                  ((TriangleSoupMeshBuilder *)local_e8,att_id,face_id,&local_c0);
        local_c0.attribute_element_types_.
        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_58;
        local_c0.attribute_element_types_.
        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = local_f0;
        local_88 = local_68;
        local_80 = local_f8;
        local_98 = local_78;
        local_90 = local_f4;
        TriangleSoupMeshBuilder::SetAttributeValuesForFace
                  ((TriangleSoupMeshBuilder *)local_e8,iVar3,face_id,&local_c0,&local_88,&local_98);
        face_id.value_ = face_id.value_ + 1;
      } while (num_faces != face_id.value_);
    }
    TriangleSoupMeshBuilder::Finalize(&local_c0);
    __return_storage_ptr__ = local_a0;
    (local_a0->status_).code_ = OK;
    (local_a0->status_).error_msg_._M_dataplus._M_p =
         (pointer)&(local_a0->status_).error_msg_.field_2;
    (local_a0->status_).error_msg_._M_string_length = 0;
    (local_a0->status_).error_msg_.field_2._M_local_buf[0] = '\0';
    (local_a0->value_)._M_t.super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>.
    _M_t.super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
    super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl =
         (Mesh *)local_c0.attribute_element_types_.
                 super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
    if (a_Stack_d0[0]._M_head_impl != (Mesh *)0x0) {
      (*((a_Stack_d0[0]._M_head_impl)->super_PointCloud)._vptr_PointCloud[1])();
    }
    a_Stack_d0[0]._M_head_impl = (Mesh *)0x0;
    if (local_e8 == (undefined1  [8])0x0) {
      return __return_storage_ptr__;
    }
    local_c0.attribute_element_types_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = local_d8 + -(long)local_e8;
    auVar5 = local_e8;
  }
  operator_delete((void *)auVar5,
                  (ulong)local_c0.attribute_element_types_.
                         super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

StatusOr<std::unique_ptr<Mesh>> StlDecoder::DecodeFromBuffer(
    DecoderBuffer *buffer) {
  if (!strncmp(buffer->data_head(), "solid ", 6)) {
    return Status(Status::IO_ERROR,
                  "Currently only binary STL files are supported.");
  }
  buffer->Advance(80);
  uint32_t face_count;
  buffer->Decode(&face_count, 4);

  TriangleSoupMeshBuilder builder;
  builder.Start(face_count);

  const int32_t pos_att_id =
      builder.AddAttribute(GeometryAttribute::POSITION, 3, DT_FLOAT32);
  const int32_t norm_att_id =
      builder.AddAttribute(GeometryAttribute::NORMAL, 3, DT_FLOAT32);

  for (uint32_t i = 0; i < face_count; i++) {
    float data[48];
    buffer->Decode(data, 48);
    uint16_t unused;
    buffer->Decode(&unused, 2);

    builder.SetPerFaceAttributeValueForFace(
        norm_att_id, draco::FaceIndex(i),
        draco::Vector3f(data[0], data[1], data[2]).data());

    builder.SetAttributeValuesForFace(
        pos_att_id, draco::FaceIndex(i),
        draco::Vector3f(data[3], data[4], data[5]).data(),
        draco::Vector3f(data[6], data[7], data[8]).data(),
        draco::Vector3f(data[9], data[10], data[11]).data());
  }

  std::unique_ptr<Mesh> mesh = builder.Finalize();
  return mesh;
}